

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeInternalForces
          (ChElementTetraCorot_4 *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  ChMatrixDynamic<> *lhs;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  element_type *peVar27;
  element_type *peVar28;
  Index IVar29;
  uint uVar30;
  Index index_1;
  Index size_1;
  char *pcVar31;
  Index size;
  ActualDstType actualDst;
  ulong uVar32;
  ulong uVar33;
  double *pdVar34;
  Index row_1;
  Index row;
  uint uVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ChVectorDynamic<> displ;
  ChVectorDynamic<> FiK_local;
  ChMatrixDynamic<> FiR_local;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_d8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_c8;
  undefined1 local_b8 [40];
  double *local_90;
  undefined1 *puStack_88;
  Index local_80;
  double *local_70;
  ulong local_68;
  long local_60;
  ChMatrixRef local_58;
  
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0xc)
  {
    __assert_fail("Fi.size() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_4.cpp"
                  ,0xfa,
                  "virtual void chrono::fea::ChElementTetraCorot_4::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  local_d8.m_storage.m_data = (double *)0x0;
  local_d8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_d8,0xc);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[9])(this,&local_d8);
  if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols != local_d8.m_storage.m_rows) {
    pcVar31 = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
    ;
LAB_006b276c:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar31);
  }
  local_c8.m_storage.m_data = (double *)0x0;
  local_c8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_c8,
             (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows,1);
  uVar32 = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows;
  if (local_c8.m_storage.m_rows != uVar32) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_c8,uVar32,1);
  }
  lhs = &this->StiffnessMatrix;
  if (-1 < local_c8.m_storage.m_rows) {
    if (local_c8.m_storage.m_rows != 0) {
      memset(local_c8.m_storage.m_data,0,local_c8.m_storage.m_rows << 3);
    }
    local_b8._0_8_ = (PointerType)0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_c8,lhs,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_d8,(Scalar *)local_b8);
    IVar29 = local_d8.m_storage.m_rows;
    pdVar34 = local_d8.m_storage.m_data;
    peVar27 = (((this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = *(ulong *)&peVar27->field_0x38;
    dVar2 = *(double *)&peVar27->field_0x40;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar48._8_8_ = 0;
    auVar48._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar3 = vfmadd231sd_fma(auVar48,auVar38,auVar3);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = *(ulong *)&peVar27->field_0x48;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar3 = vfmadd231sd_fma(auVar3,auVar52,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar4 = vfmadd231sd_fma(auVar56,auVar38,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar4 = vfmadd231sd_fma(auVar4,auVar52,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar43._8_8_ = 0;
    auVar43._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar5 = vfmadd231sd_fma(auVar43,auVar38,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar5 = vfmadd231sd_fma(auVar5,auVar52,auVar8);
    local_b8._0_8_ = auVar3._0_8_;
    local_b8._8_8_ = auVar4._0_8_;
    local_b8._16_8_ = auVar5._0_8_;
    if (local_d8.m_storage.m_rows < 3) {
LAB_006b26c9:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    uVar35 = 3;
    if ((((ulong)local_d8.m_storage.m_data & 7) == 0) &&
       (uVar30 = -((uint)((ulong)local_d8.m_storage.m_data >> 3) & 0x1fffffff) & 7, uVar30 < 3)) {
      uVar35 = uVar30;
    }
    if (uVar35 != 0) {
      memcpy(local_d8.m_storage.m_data,local_b8,(ulong)(uVar35 * 8));
    }
    if (uVar35 < 3) {
      uVar32 = (ulong)(uVar35 << 3);
      memcpy((void *)((long)pdVar34 + uVar32),local_b8 + uVar32,0x18 - uVar32);
    }
    peVar27 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *(ulong *)&peVar27->field_0x38;
    dVar2 = *(double *)&peVar27->field_0x40;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar3 = vfmadd231sd_fma(auVar49,auVar39,auVar9);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = *(ulong *)&peVar27->field_0x48;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar3 = vfmadd231sd_fma(auVar3,auVar53,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar57._8_8_ = 0;
    auVar57._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar4 = vfmadd231sd_fma(auVar57,auVar39,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar4 = vfmadd231sd_fma(auVar4,auVar53,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar5 = vfmadd231sd_fma(auVar44,auVar39,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar5 = vfmadd231sd_fma(auVar5,auVar53,auVar14);
    local_b8._0_8_ = auVar3._0_8_;
    local_b8._8_8_ = auVar4._0_8_;
    local_b8._16_8_ = auVar5._0_8_;
    if (IVar29 < 6) goto LAB_006b26c9;
    pdVar1 = pdVar34 + 3;
    uVar35 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar30 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7, uVar30 < 3)) {
      uVar35 = uVar30;
    }
    if (uVar35 != 0) {
      memcpy(pdVar1,local_b8,(ulong)(uVar35 * 8));
    }
    if (uVar35 < 3) {
      uVar32 = (ulong)(uVar35 << 3);
      memcpy((void *)((long)pdVar34 + uVar32 + 0x18),local_b8 + uVar32,0x18 - uVar32);
    }
    peVar27 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = *(ulong *)&peVar27->field_0x38;
    dVar2 = *(double *)&peVar27->field_0x40;
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar50._8_8_ = 0;
    auVar50._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar3 = vfmadd231sd_fma(auVar50,auVar40,auVar15);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = *(ulong *)&peVar27->field_0x48;
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar3 = vfmadd231sd_fma(auVar3,auVar54,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar58._8_8_ = 0;
    auVar58._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar4 = vfmadd231sd_fma(auVar58,auVar40,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar4 = vfmadd231sd_fma(auVar4,auVar54,auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar5 = vfmadd231sd_fma(auVar45,auVar40,auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar5 = vfmadd231sd_fma(auVar5,auVar54,auVar20);
    local_b8._0_8_ = auVar3._0_8_;
    local_b8._8_8_ = auVar4._0_8_;
    local_b8._16_8_ = auVar5._0_8_;
    if (IVar29 < 9) goto LAB_006b26c9;
    pdVar1 = pdVar34 + 6;
    uVar35 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar30 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7, uVar30 < 3)) {
      uVar35 = uVar30;
    }
    if (uVar35 != 0) {
      memcpy(pdVar1,local_b8,(ulong)(uVar35 * 8));
    }
    if (uVar35 < 3) {
      uVar32 = (ulong)(uVar35 << 3);
      memcpy((void *)((long)pdVar34 + uVar32 + 0x30),local_b8 + uVar32,0x18 - uVar32);
    }
    peVar27 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = *(ulong *)&peVar27->field_0x38;
    dVar2 = *(double *)&peVar27->field_0x40;
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar51._8_8_ = 0;
    auVar51._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar3 = vfmadd231sd_fma(auVar51,auVar41,auVar21);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = *(ulong *)&peVar27->field_0x48;
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar3 = vfmadd231sd_fma(auVar3,auVar55,auVar22);
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar59._8_8_ = 0;
    auVar59._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar4 = vfmadd231sd_fma(auVar59,auVar41,auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar4 = vfmadd231sd_fma(auVar4,auVar55,auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar5 = vfmadd231sd_fma(auVar46,auVar41,auVar25);
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar5 = vfmadd231sd_fma(auVar5,auVar55,auVar26);
    local_b8._0_8_ = auVar3._0_8_;
    local_b8._8_8_ = auVar4._0_8_;
    local_b8._16_8_ = auVar5._0_8_;
    if (IVar29 < 0xc) goto LAB_006b26c9;
    pdVar1 = pdVar34 + 9;
    uVar35 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar30 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7, uVar30 < 3)) {
      uVar35 = uVar30;
    }
    if (uVar35 != 0) {
      memcpy(pdVar1,local_b8,(ulong)(uVar35 * 8));
    }
    if (uVar35 < 3) {
      uVar32 = (ulong)(uVar35 << 3);
      memcpy((void *)((long)pdVar34 + uVar32 + 0x48),local_b8 + uVar32,0x18 - uVar32);
    }
    uVar32 = (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
    uVar33 = (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
    if ((long)(uVar33 | uVar32) < 0) {
      pcVar31 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_006b274a;
    }
    local_b8._24_8_ =
         ((this->Material).
          super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         damping_K;
    local_b8._8_8_ = uVar32;
    local_b8._16_8_ = uVar33;
    local_b8._32_8_ = lhs;
    if (uVar33 != IVar29) {
      pcVar31 = 
      "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
      ;
      puStack_88 = (undefined1 *)&local_d8;
      goto LAB_006b276c;
    }
    puStack_88 = (undefined1 *)&local_d8;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_70,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_b8);
    if (-1 < local_d8.m_storage.m_rows) {
      peVar28 = (this->Material).
                super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      dVar2 = this->Volume * (peVar28->super_ChContinuumMaterial).density * 0.25 *
              peVar28->damping_M;
      uVar32 = local_d8.m_storage.m_rows & 0x7ffffffffffffff8;
      if (7 < local_d8.m_storage.m_rows) {
        auVar42._8_8_ = 0;
        auVar42._0_8_ = dVar2;
        auVar36 = vbroadcastsd_avx512f(auVar42);
        uVar33 = 0;
        do {
          auVar37 = vmulpd_avx512f(auVar36,*(undefined1 (*) [64])
                                            (local_d8.m_storage.m_data + uVar33));
          *(undefined1 (*) [64])(local_d8.m_storage.m_data + uVar33) = auVar37;
          uVar33 = uVar33 + 8;
        } while (uVar33 < uVar32);
      }
      if ((long)uVar32 < local_d8.m_storage.m_rows) {
        do {
          local_d8.m_storage.m_data[uVar32] = dVar2 * local_d8.m_storage.m_data[uVar32];
          uVar32 = uVar32 + 1;
        } while (local_d8.m_storage.m_rows != uVar32);
      }
      if ((local_68 != local_d8.m_storage.m_rows) || (local_60 != 1)) {
        pcVar31 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
LAB_006b27a2:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar31);
      }
      if (0 < (long)local_68) {
        uVar32 = 0;
        pdVar34 = local_70;
        do {
          *pdVar34 = local_d8.m_storage.m_data[uVar32] + *pdVar34;
          uVar32 = uVar32 + 1;
          pdVar34 = pdVar34 + 1;
        } while (local_68 != uVar32);
      }
      if (local_c8.m_storage.m_rows != local_68) {
        pcVar31 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
        goto LAB_006b27a2;
      }
      if (0 < local_c8.m_storage.m_rows) {
        uVar32 = 0;
        pdVar34 = local_70;
        do {
          local_c8.m_storage.m_data[uVar32] = *pdVar34 + local_c8.m_storage.m_data[uVar32];
          uVar32 = uVar32 + 1;
          pdVar34 = pdVar34 + 1;
        } while (local_c8.m_storage.m_rows != uVar32);
      }
      if (-1 < local_c8.m_storage.m_rows) {
        uVar32 = local_c8.m_storage.m_rows & 0x7ffffffffffffff8;
        if (7 < local_c8.m_storage.m_rows) {
          uVar33 = 0;
          auVar36 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
          do {
            auVar37 = vxorpd_avx512dq(auVar36,*(undefined1 (*) [64])
                                               (local_c8.m_storage.m_data + uVar33));
            *(undefined1 (*) [64])(local_c8.m_storage.m_data + uVar33) = auVar37;
            uVar33 = uVar33 + 8;
          } while (uVar33 < uVar32);
        }
        if ((long)uVar32 < local_c8.m_storage.m_rows) {
          do {
            auVar47._0_8_ = -local_c8.m_storage.m_data[uVar32];
            auVar47._8_8_ = 0x8000000000000000;
            dVar2 = (double)vmovlpd_avx(auVar47);
            local_c8.m_storage.m_data[uVar32] = dVar2;
            uVar32 = uVar32 + 1;
          } while (local_c8.m_storage.m_rows != uVar32);
        }
        local_90 = (double *)0x0;
        puStack_88 = (undefined1 *)0x0;
        local_80 = 0;
        local_b8._0_8_ = local_c8.m_storage.m_data;
        local_b8._8_8_ = local_c8.m_storage.m_rows;
        local_b8._16_8_ = 1;
        local_b8._24_8_ = 1;
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 0;
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_data = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value =
             (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value = 1;
        if (local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value < 0 &&
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                       );
        }
        local_58.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        .m_stride.m_outer.m_value = 1;
        ChMatrixCorotation::ComputeCK
                  ((ChMatrixConstRef)local_b8,&(this->super_ChElementCorotational).A,4,&local_58);
        if (local_90 != (double *)0x0) {
          free((void *)local_90[-1]);
        }
        if (local_70 != (double *)0x0) {
          free((void *)local_70[-1]);
        }
        if (local_c8.m_storage.m_data != (double *)0x0) {
          free((void *)local_c8.m_storage.m_data[-1]);
        }
        if (local_d8.m_storage.m_data != (double *)0x0) {
          free((void *)local_d8.m_storage.m_data[-1]);
        }
        return;
      }
    }
  }
  pcVar31 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_006b274a:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar31);
}

Assistant:

void ChElementTetraCorot_4::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 12);

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(12);
    this->GetStateBlock(displ);  // nodal displacements, local

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    displ.segment(0, 3) = (A.transpose() * nodes[0]->pos_dt).eigen();  // nodal speeds, local
    displ.segment(3, 3) = (A.transpose() * nodes[1]->pos_dt).eigen();
    displ.segment(6, 3) = (A.transpose() * nodes[2]->pos_dt).eigen();
    displ.segment(9, 3) = (A.transpose() * nodes[3]->pos_dt).eigen();
    ChMatrixDynamic<> FiR_local = Material->Get_RayleighDampingK() * StiffnessMatrix * displ;

    double lumped_node_mass = (this->GetVolume() * this->Material->Get_density()) / 4.0;
    displ *= lumped_node_mass * this->Material->Get_RayleighDampingM();
    FiR_local += displ;

    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 4, Fi);
}